

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_rmdir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  int iVar1;
  char *__path;
  int status;
  char *pathstr;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen path_local;
  
  __path = mkstr(path);
  iVar1 = rmdir(__path);
  free(__path);
  if (iVar1 < 0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    fxp_reply_ok(reply);
  }
  return;
}

Assistant:

static void uss_rmdir(SftpServer *srv, SftpReplyBuilder *reply, ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    int status = rmdir(pathstr);
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}